

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O2

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetFullName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  local_38.View_._M_str = (this->Name)._M_dataplus._M_p;
  local_38.View_._M_len = (this->Name)._M_string_length;
  local_68.View_._M_len = 0xb;
  local_68.View_._M_str = ".framework/";
  cmStrCat<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,&local_38,&local_68,&this->Name,&this->Suffix);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFullName() const
    {
      return cmStrCat(this->Name, ".framework/"_s, this->Name, this->Suffix);
    }